

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::GetAttachmentParametersTest::TestDefaultFramebuffer
          (GetAttachmentParametersTest *this)

{
  GLenum GVar1;
  undefined4 uVar2;
  char *pcVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  size_t sVar7;
  GLchar **ppGVar8;
  long lVar9;
  bool bVar10;
  GLint parameter_legacy;
  GLint optional_parameter_dsa;
  GLint optional_parameter_legacy;
  GLint parameter_dsa;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  GetAttachmentParametersTest *local_1d0;
  long local_1c8;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  long lVar6;
  
  local_1d0 = this;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  bVar10 = true;
  lVar9 = 0;
  do {
    local_1e0 = 0;
    local_1d4 = 0;
    GVar1 = TestDefaultFramebuffer::attachments[lVar9];
    (**(code **)(lVar6 + 0x830))(0x8d40,GVar1,0x8cd0,&local_1e0);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glGetFramebufferParameteriv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x1085);
    (**(code **)(lVar6 + 0x910))(0,GVar1,0x8cd0,&local_1d4);
    iVar4 = (**(code **)(lVar6 + 0x800))();
    local_1c8 = lVar9;
    if (iVar4 == 0) {
      if (local_1e0 != local_1d4) {
        local_1b0 = (undefined1  [8])((local_1d0->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"GetNamedFramebufferAttachmentParameteriv returned ",0x32);
        std::ostream::operator<<((ostringstream *)local_1a8,local_1d4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", but ",6);
        std::ostream::operator<<((ostringstream *)local_1a8,local_1e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   " was expected for GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name of default framebuffer."
                   ,0x5e);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00a9dc6c;
      }
      if (local_1e0 != 0) {
        ppGVar8 = TestDefaultFramebuffer::optional_pnames_strings;
        lVar9 = 0;
        do {
          local_1d8 = 0;
          local_1dc = 0;
          uVar2 = *(undefined4 *)((long)TestDefaultFramebuffer::optional_pnames + lVar9);
          (**(code **)(lVar6 + 0x830))(0x8d40,GVar1,uVar2,&local_1d8);
          dVar5 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar5,"glGetFramebufferParameteriv has failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                          ,0x10be);
          (**(code **)(lVar6 + 0x910))(0,GVar1,uVar2,&local_1dc);
          iVar4 = (**(code **)(lVar6 + 0x800))();
          if (iVar4 == 0) {
            if (local_1d8 != local_1dc) {
              local_1b0 = (undefined1  [8])((local_1d0->super_TestCase).m_context)->m_testCtx->m_log
              ;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"GetNamedFramebufferAttachmentParameteriv returned ",
                         0x32);
              std::ostream::operator<<((ostringstream *)local_1a8,local_1dc);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", but ",6);
              std::ostream::operator<<((ostringstream *)local_1a8,local_1d8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8," was expected for ",0x12);
              std::ostream::_M_insert<void_const*>((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8," parameter name  for ",0x15);
              pcVar3 = TestDefaultFramebuffer::attachments_strings[local_1c8];
              sVar7 = strlen(pcVar3);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar7);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8," attachment of default framebuffer.",0x23);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              goto LAB_00a9dbb2;
            }
          }
          else {
            local_1b0 = (undefined1  [8])((local_1d0->super_TestCase).m_context)->m_testCtx->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "GetNamedFramebufferAttachmentParameteriv unexpectedly generated ",0x40);
            local_1c0.m_getName = glu::getErrorName;
            local_1c0.m_value = iVar4;
            tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8," error when called with ",0x18);
            pcVar3 = *ppGVar8;
            if (pcVar3 == (char *)0x0) {
              std::ios::clear((int)*(_func_int **)(local_1a8._0_8_ + -0x18) +
                              (int)(ostringstream *)local_1a8);
            }
            else {
              sVar7 = strlen(pcVar3);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8," parameter name for ",0x14);
            pcVar3 = TestDefaultFramebuffer::attachments_strings[local_1c8];
            sVar7 = strlen(pcVar3);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       " attachment of default framebuffer. The GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE was "
                       ,0x52);
            std::ostream::operator<<((ostringstream *)local_1a8,local_1e0);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00a9dbb2:
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            bVar10 = false;
          }
          lVar9 = lVar9 + 4;
          ppGVar8 = ppGVar8 + 1;
        } while (lVar9 != 0x20);
      }
    }
    else {
      local_1b0 = (undefined1  [8])((local_1d0->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "GetNamedFramebufferAttachmentParameteriv unexpectedly generated ",0x40);
      local_1c0.m_getName = glu::getErrorName;
      local_1c0.m_value = iVar4;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 " error when called with GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name for "
                 ,0x51);
      pcVar3 = TestDefaultFramebuffer::attachments_strings[lVar9];
      sVar7 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8," attachment of default framebuffer.",0x23);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00a9dc6c:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      bVar10 = false;
    }
    lVar9 = local_1c8 + 1;
    if (lVar9 == 6) {
      return bVar10;
    }
  } while( true );
}

Assistant:

bool GetAttachmentParametersTest::TestDefaultFramebuffer()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	static const glw::GLenum attachments[] = { GL_FRONT_LEFT, GL_FRONT_RIGHT, GL_BACK_LEFT,
											   GL_BACK_RIGHT, GL_DEPTH,		  GL_STENCIL };

	static const glw::GLchar* attachments_strings[] = { "GL_FRONT_LEFT", "GL_FRONT_RIGHT", "GL_BACK_LEFT",
														"GL_BACK_RIGHT", "GL_DEPTH",	   "GL_STENCIL" };

	static const glw::GLuint attachments_count = sizeof(attachments) / sizeof(attachments[0]);

	for (glw::GLuint j = 0; j < attachments_count; ++j)
	{
		glw::GLint parameter_legacy = 0;
		glw::GLint parameter_dsa	= 0;

		gl.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, attachments[j], GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE,
											   &parameter_legacy);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFramebufferParameteriv has failed");

		gl.getNamedFramebufferAttachmentParameteriv(0, attachments[j], GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE,
													&parameter_dsa);

		/* Error check. */
		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv unexpectedly generated "
				<< glu::getErrorStr(error)
				<< " error when called with GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name for "
				<< attachments_strings[j] << " attachment of default framebuffer." << tcu::TestLog::EndMessage;

			is_ok = false;

			continue;
		}

		if (parameter_legacy != parameter_dsa)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv returned " << parameter_dsa
				<< ", but " << parameter_legacy
				<< " was expected for GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name of default framebuffer."
				<< tcu::TestLog::EndMessage;

			is_ok = false;

			continue;
		}

		if (parameter_dsa != GL_NONE)
		{
			static const glw::GLenum optional_pnames[] = {
				GL_FRAMEBUFFER_ATTACHMENT_RED_SIZE,		  GL_FRAMEBUFFER_ATTACHMENT_GREEN_SIZE,
				GL_FRAMEBUFFER_ATTACHMENT_BLUE_SIZE,	  GL_FRAMEBUFFER_ATTACHMENT_ALPHA_SIZE,
				GL_FRAMEBUFFER_ATTACHMENT_DEPTH_SIZE,	 GL_FRAMEBUFFER_ATTACHMENT_STENCIL_SIZE,
				GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE, GL_FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING
			};

			static const glw::GLchar* optional_pnames_strings[] = {
				"GL_FRAMEBUFFER_ATTACHMENT_RED_SIZE",		"GL_FRAMEBUFFER_ATTACHMENT_GREEN_SIZE",
				"GL_FRAMEBUFFER_ATTACHMENT_BLUE_SIZE",		"GL_FRAMEBUFFER_ATTACHMENT_ALPHA_SIZE",
				"GL_FRAMEBUFFER_ATTACHMENT_DEPTH_SIZE",		"GL_FRAMEBUFFER_ATTACHMENT_STENCIL_SIZE",
				"GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE", "GL_FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING"
			};

			static const glw::GLuint optional_pnames_count = sizeof(optional_pnames) / sizeof(optional_pnames[0]);

			for (glw::GLuint i = 0; i < optional_pnames_count; ++i)
			{
				glw::GLint optional_parameter_legacy = 0;
				glw::GLint optional_parameter_dsa	= 0;

				gl.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, attachments[j], optional_pnames[i],
													   &optional_parameter_legacy);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFramebufferParameteriv has failed");

				gl.getNamedFramebufferAttachmentParameteriv(0, attachments[j], optional_pnames[i],
															&optional_parameter_dsa);

				if (glw::GLenum error = gl.getError())
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv unexpectedly generated "
						<< glu::getErrorStr(error) << " error when called with " << optional_pnames_strings[i]
						<< " parameter name for " << attachments_strings[j]
						<< " attachment of default framebuffer. The GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE was "
						<< parameter_legacy << "." << tcu::TestLog::EndMessage;

					is_ok = false;

					continue;
				}

				if (optional_parameter_legacy != optional_parameter_dsa)
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv returned "
						<< optional_parameter_dsa << ", but " << optional_parameter_legacy << " was expected for "
						<< optional_pnames_strings << " parameter name  for " << attachments_strings[j]
						<< " attachment of default framebuffer." << tcu::TestLog::EndMessage;

					is_ok = false;

					continue;
				}
			}
		}
	}

	return is_ok;
}